

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
::destroy(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:236:23)>
          *this)

{
  AsyncMessageReader *pAVar1;
  Disposer *pDVar2;
  PromiseArenaMember *node;
  
  TransformPromiseNodeBase::dropDependency(&this->super_TransformPromiseNodeBase);
  pAVar1 = (this->func).reader.ptr;
  if (pAVar1 != (AsyncMessageReader *)0x0) {
    (this->func).reader.ptr = (AsyncMessageReader *)0x0;
    pDVar2 = (this->func).reader.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(code *)((long)(pAVar1->super_MessageReader).arenaSpace +
                              (long)((pAVar1->super_MessageReader)._vptr_MessageReader[-2] + -0x18))
              );
  }
  (this->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_006dcee0;
  node = &((this->super_TransformPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_TransformPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }